

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Session_deleteSubscription(UA_Server *server,UA_Session *session,UA_UInt32 subscriptionID)

{
  UA_Subscription *pUVar1;
  UA_Subscription **ppUVar2;
  UA_StatusCode UVar3;
  UA_Subscription *subscription;
  
  subscription = UA_Session_getSubscriptionByID(session,subscriptionID);
  if (subscription == (UA_Subscription *)0x0) {
    UVar3 = 0x80280000;
  }
  else {
    pUVar1 = (subscription->listEntry).le_next;
    ppUVar2 = (subscription->listEntry).le_prev;
    if (pUVar1 != (UA_Subscription *)0x0) {
      (pUVar1->listEntry).le_prev = ppUVar2;
    }
    *ppUVar2 = pUVar1;
    UA_Subscription_deleteMembers(subscription,server);
    free(subscription);
    UVar3 = 0;
  }
  return UVar3;
}

Assistant:

UA_StatusCode
UA_Session_deleteSubscription(UA_Server *server, UA_Session *session,
                              UA_UInt32 subscriptionID) {
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, subscriptionID);
    if(!sub)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
    LIST_REMOVE(sub, listEntry);
    UA_Subscription_deleteMembers(sub, server);
    UA_free(sub);
    return UA_STATUSCODE_GOOD;
}